

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.h
# Opt level: O0

int head_size(int value)

{
  undefined4 local_c;
  int value_local;
  
  if (value < 0) {
    local_c = 0;
  }
  else if (value < 0x80) {
    local_c = 1;
  }
  else if (value < 0x800) {
    local_c = 2;
  }
  else if (value < 0x10000) {
    local_c = 3;
  }
  else if (value < 0x200000) {
    local_c = 4;
  }
  else if (value < 0x4000000) {
    local_c = 5;
  }
  else {
    local_c = 6;
  }
  return local_c;
}

Assistant:

inline int head_size(int value)
{
    if (value < 0)
        return 0;
    else if (value <= 0x0000007F)
        return 1;
    else if (value <= 0x000007FF)
        return 2;
    else if (value <= 0x0000FFFF)
        return 3;
    else if (value <= 0x001FFFFF)
        return 4;
    else if (value <= 0x03FFFFFF)
        return 5;
    else if (value <= 0x7FFFFFFF)
        return 6;
    else
        return -1;
}